

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

Option * __thiscall
CLI::App::
add_option_function<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
          (App *this,string *option_name,
          function<void_(const_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&)>
          *func,string *option_description)

{
  pointer pcVar1;
  Option *this_00;
  anon_class_32_1_898bcfc2 fun;
  string local_e8;
  string local_c8;
  string local_a8;
  _Any_data local_88;
  code *local_78;
  _Any_data local_68;
  code *local_58;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  
  std::
  function<void_(const_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&)>
  ::function((function<void_(const_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&)>
              *)&local_68,func);
  pcVar1 = (option_name->_M_dataplus)._M_p;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar1,pcVar1 + option_name->_M_string_length);
  ::std::
  function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>::
  function<CLI::App::add_option_function<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(std::__cxx11::string,std::function<void(std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>const&)>const&,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
              *)local_88._M_pod_data,(anon_class_32_1_898bcfc2 *)&local_68);
  pcVar1 = (option_description->_M_dataplus)._M_p;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar1,pcVar1 + option_description->_M_string_length);
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  this_00 = add_option(this,&local_c8,(callback_t *)&local_88,&local_e8,false,
                       (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                        *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_a8.field_2._M_allocated_capacity._0_4_ = 0x54584554;
  local_a8._M_string_length = 4;
  local_a8.field_2._M_allocated_capacity._4_4_ =
       local_a8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  Option::type_name(this_00,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT44(local_a8.field_2._M_allocated_capacity._4_4_,
                             local_a8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  this_00->type_size_min_ = 1;
  this_00->expected_min_ = 1;
  this_00->type_size_max_ = 0x20000000;
  this_00->inject_separator_ = true;
  this_00->expected_max_ = 0x20000000;
  this_00->allow_extra_args_ = true;
  this_00->flag_like_ = false;
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return this_00;
}

Assistant:

Option *add_option_function(std::string option_name,
                                const std::function<void(const ArgType &)> &func,  ///< the callback to execute
                                std::string option_description = "") {

        auto fun = [func](const CLI::results_t &res) {
            ArgType variable;
            bool result = detail::lexical_conversion<ArgType, ArgType>(res, variable);
            if(result) {
                func(variable);
            }
            return result;
        };

        Option *opt = add_option(option_name, std::move(fun), option_description, false);
        opt->type_name(detail::type_name<ArgType>());
        opt->type_size(detail::type_count_min<ArgType>::value, detail::type_count<ArgType>::value);
        opt->expected(detail::expected_count<ArgType>::value);
        return opt;
    }